

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int geopolyUpdate(sqlite3_vtab *pVtab,int nData,sqlite3_value **aData,sqlite_int64 *pRowid)

{
  long lVar1;
  int iVar2;
  int iVar3;
  Rtree *pRtree_00;
  Rtree *pRVar4;
  GeoPoly *pGVar5;
  RtreeCell *in_RCX;
  Rtree *in_RDX;
  int in_ESI;
  Rtree *in_RDI;
  long in_FS_OFFSET;
  bool bVar6;
  GeoPoly *p;
  int nChange;
  int jj;
  sqlite3_stmt *pUp;
  int rc2;
  int steprc;
  int coordChange;
  int newRowidValid;
  i64 newRowid;
  int oldRowidValid;
  i64 oldRowid;
  Rtree *pRtree;
  RtreeNode *pLeaf;
  int rc;
  RtreeCell cell;
  undefined4 in_stack_ffffffffffffff28;
  int in_stack_ffffffffffffff2c;
  Rtree *pRtree_01;
  undefined4 in_stack_ffffffffffffff38;
  uint in_stack_ffffffffffffff3c;
  Rtree *in_stack_ffffffffffffff48;
  undefined4 in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff54;
  undefined4 uVar7;
  RtreeCoord *in_stack_ffffffffffffff58;
  sqlite3_stmt *pStmt;
  int in_stack_ffffffffffffff60;
  int in_stack_ffffffffffffff64;
  int iVar8;
  uint uVar9;
  Rtree *ppLeaf;
  int local_4c;
  int local_3c;
  Rtree *local_38 [5];
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  local_3c = 0;
  memcpy(local_38,&DAT_002b12f0,0x30);
  iVar8 = 0;
  if (in_RDI->nNodeRef == 0) {
    rtreeReference(in_RDI);
    iVar2 = sqlite3_value_type((sqlite3_value *)(in_RDX->base).pModule);
    bVar6 = iVar2 != 5;
    if (bVar6) {
      pRtree_00 = (Rtree *)sqlite3_value_int64((sqlite3_value *)0x2a37ce);
    }
    else {
      pRtree_00 = (Rtree *)0x0;
    }
    in_stack_ffffffffffffff3c = in_stack_ffffffffffffff3c & 0xffffff;
    ppLeaf = pRtree_00;
    if (1 < in_ESI) {
      iVar2 = sqlite3_value_type(*(sqlite3_value **)&(in_RDX->base).nRef);
      in_stack_ffffffffffffff3c = CONCAT13(iVar2 != 5,(int3)in_stack_ffffffffffffff3c);
    }
    uVar9 = in_stack_ffffffffffffff3c >> 0x18;
    if (uVar9 == 0) {
      pRVar4 = (Rtree *)0x0;
    }
    else {
      pRVar4 = (Rtree *)sqlite3_value_int64((sqlite3_value *)0x2a382f);
    }
    pRtree_01 = pRVar4;
    local_38[0] = pRVar4;
    if ((1 < in_ESI) &&
       (((!bVar6 ||
         (iVar2 = sqlite3_value_nochange((sqlite3_value *)(in_RDX->base).zErrMsg), iVar2 == 0)) ||
        (ppLeaf != pRVar4)))) {
      geopolyBBox((sqlite3_context *)CONCAT44(uVar9,iVar8),
                  (sqlite3_value *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                  in_stack_ffffffffffffff58,
                  (int *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50));
      iVar8 = 1;
      if ((uVar9 != 0) && ((!bVar6 || (ppLeaf != pRVar4)))) {
        sqlite3_bind_int64((sqlite3_stmt *)pRtree_00,in_stack_ffffffffffffff3c,
                           (sqlite_int64)pRtree_01);
        in_stack_ffffffffffffff64 = sqlite3_step((sqlite3_stmt *)in_stack_ffffffffffffff58);
        iVar2 = (int)((ulong)in_stack_ffffffffffffff58 >> 0x20);
        local_3c = sqlite3_reset((sqlite3_stmt *)pRtree_00);
        if (in_stack_ffffffffffffff64 == 100) {
          iVar3 = sqlite3_vtab_on_conflict(in_RDI->db);
          if (iVar3 == 5) {
            local_3c = rtreeDeleteRowid(in_stack_ffffffffffffff48,(sqlite3_int64)pRtree_00);
          }
          else {
            local_3c = rtreeConstraintError
                                 ((Rtree *)CONCAT44(in_stack_ffffffffffffff64,
                                                    in_stack_ffffffffffffff60),iVar2);
          }
        }
      }
    }
    if ((local_3c == 0) && ((in_ESI == 1 || ((iVar8 != 0 && (bVar6)))))) {
      local_3c = rtreeDeleteRowid(in_stack_ffffffffffffff48,(sqlite3_int64)pRtree_00);
    }
    if (((local_3c == 0) && (1 < in_ESI)) && (iVar8 != 0)) {
      if (uVar9 == 0) {
        local_3c = rtreeNewRowid(pRtree_01,
                                 (i64 *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28
                                                ));
      }
      in_RCX->iRowid = (i64)local_38[0];
      if (local_3c == 0) {
        local_3c = ChooseLeaf(in_RDX,in_RCX,(int)((ulong)in_RDI >> 0x20),(RtreeNode **)ppLeaf);
      }
      if (local_3c == 0) {
        local_3c = rtreeInsertCell(pRtree_00,
                                   (RtreeNode *)
                                   CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38),
                                   (RtreeCell *)pRtree_01,in_stack_ffffffffffffff2c);
        in_stack_ffffffffffffff60 =
             nodeRelease(pRtree_01,
                         (RtreeNode *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28))
        ;
        if (local_3c == 0) {
          local_3c = in_stack_ffffffffffffff60;
        }
      }
    }
    if ((local_3c == 0) && (1 < in_ESI)) {
      pStmt = in_RDI->pWriteAux;
      uVar7 = 0xaaaaaaaa;
      iVar3 = 0;
      sqlite3_bind_int64((sqlite3_stmt *)pRtree_00,in_stack_ffffffffffffff3c,(sqlite_int64)pRtree_01
                        );
      iVar2 = sqlite3_value_nochange((sqlite3_value *)(in_RDX->base).zErrMsg);
      if (iVar2 == 0) {
        iVar2 = sqlite3_value_type((sqlite3_value *)(in_RDX->base).zErrMsg);
        if ((iVar2 == 3) &&
           (pGVar5 = geopolyFuncParam((sqlite3_context *)CONCAT44(uVar9,iVar8),
                                      (sqlite3_value *)
                                      CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                                      (int *)pStmt), pGVar5 != (GeoPoly *)0x0)) {
          sqlite3_bind_blob((sqlite3_stmt *)pRtree_00,in_stack_ffffffffffffff3c,pRtree_01,
                            in_stack_ffffffffffffff2c,(_func_void_void_ptr *)0x2a3bcb);
        }
        else {
          sqlite3_bind_value((sqlite3_stmt *)
                             CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                             (int)((ulong)pStmt >> 0x20),(sqlite3_value *)CONCAT44(uVar7,iVar3));
        }
        sqlite3_free((void *)0x2a3bef);
        iVar3 = 1;
      }
      else {
        sqlite3_bind_null((sqlite3_stmt *)pRtree_01,in_stack_ffffffffffffff2c);
      }
      for (iVar8 = 1; iVar8 < in_ESI + -2; iVar8 = iVar8 + 1) {
        iVar3 = iVar3 + 1;
        sqlite3_bind_value((sqlite3_stmt *)
                           CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                           (int)((ulong)pStmt >> 0x20),(sqlite3_value *)CONCAT44(iVar8,iVar3));
      }
      if (iVar3 != 0) {
        sqlite3_step(pStmt);
        local_3c = sqlite3_reset((sqlite3_stmt *)pRtree_00);
      }
    }
    rtreeRelease((Rtree *)0x2a3c7a);
    local_4c = local_3c;
  }
  else {
    local_4c = 0x206;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return local_4c;
}

Assistant:

static int geopolyUpdate(
  sqlite3_vtab *pVtab,
  int nData,
  sqlite3_value **aData,
  sqlite_int64 *pRowid
){
  Rtree *pRtree = (Rtree *)pVtab;
  int rc = SQLITE_OK;
  RtreeCell cell;                 /* New cell to insert if nData>1 */
  i64 oldRowid;                   /* The old rowid */
  int oldRowidValid;              /* True if oldRowid is valid */
  i64 newRowid;                   /* The new rowid */
  int newRowidValid;              /* True if newRowid is valid */
  int coordChange = 0;            /* Change in coordinates */

  if( pRtree->nNodeRef ){
    /* Unable to write to the btree while another cursor is reading from it,
    ** since the write might do a rebalance which would disrupt the read
    ** cursor. */
    return SQLITE_LOCKED_VTAB;
  }
  rtreeReference(pRtree);
  assert(nData>=1);

  oldRowidValid = sqlite3_value_type(aData[0])!=SQLITE_NULL;;
  oldRowid = oldRowidValid ? sqlite3_value_int64(aData[0]) : 0;
  newRowidValid = nData>1 && sqlite3_value_type(aData[1])!=SQLITE_NULL;
  newRowid = newRowidValid ? sqlite3_value_int64(aData[1]) : 0;
  cell.iRowid = newRowid;

  if( nData>1                                 /* not a DELETE */
   && (!oldRowidValid                         /* INSERT */
        || !sqlite3_value_nochange(aData[2])  /* UPDATE _shape */
        || oldRowid!=newRowid)                /* Rowid change */
  ){
    assert( aData[2]!=0 );
    geopolyBBox(0, aData[2], cell.aCoord, &rc);
    if( rc ){
      if( rc==SQLITE_ERROR ){
        pVtab->zErrMsg =
          sqlite3_mprintf("_shape does not contain a valid polygon");
      }
      goto geopoly_update_end;
    }
    coordChange = 1;

    /* If a rowid value was supplied, check if it is already present in
    ** the table. If so, the constraint has failed. */
    if( newRowidValid && (!oldRowidValid || oldRowid!=newRowid) ){
      int steprc;
      sqlite3_bind_int64(pRtree->pReadRowid, 1, cell.iRowid);
      steprc = sqlite3_step(pRtree->pReadRowid);
      rc = sqlite3_reset(pRtree->pReadRowid);
      if( SQLITE_ROW==steprc ){
        if( sqlite3_vtab_on_conflict(pRtree->db)==SQLITE_REPLACE ){
          rc = rtreeDeleteRowid(pRtree, cell.iRowid);
        }else{
          rc = rtreeConstraintError(pRtree, 0);
        }
      }
    }
  }

  /* If aData[0] is not an SQL NULL value, it is the rowid of a
  ** record to delete from the r-tree table. The following block does
  ** just that.
  */
  if( rc==SQLITE_OK && (nData==1 || (coordChange && oldRowidValid)) ){
    rc = rtreeDeleteRowid(pRtree, oldRowid);
  }

  /* If the aData[] array contains more than one element, elements
  ** (aData[2]..aData[argc-1]) contain a new record to insert into
  ** the r-tree structure.
  */
  if( rc==SQLITE_OK && nData>1 && coordChange ){
    /* Insert the new record into the r-tree */
    RtreeNode *pLeaf = 0;
    if( !newRowidValid ){
      rc = rtreeNewRowid(pRtree, &cell.iRowid);
    }
    *pRowid = cell.iRowid;
    if( rc==SQLITE_OK ){
      rc = ChooseLeaf(pRtree, &cell, 0, &pLeaf);
    }
    if( rc==SQLITE_OK ){
      int rc2;
      rc = rtreeInsertCell(pRtree, pLeaf, &cell, 0);
      rc2 = nodeRelease(pRtree, pLeaf);
      if( rc==SQLITE_OK ){
        rc = rc2;
      }
    }
  }

  /* Change the data */
  if( rc==SQLITE_OK && nData>1 ){
    sqlite3_stmt *pUp = pRtree->pWriteAux;
    int jj;
    int nChange = 0;
    sqlite3_bind_int64(pUp, 1, cell.iRowid);
    assert( pRtree->nAux>=1 );
    if( sqlite3_value_nochange(aData[2]) ){
      sqlite3_bind_null(pUp, 2);
    }else{
      GeoPoly *p = 0;
      if( sqlite3_value_type(aData[2])==SQLITE_TEXT
       && (p = geopolyFuncParam(0, aData[2], &rc))!=0
       && rc==SQLITE_OK
      ){
        sqlite3_bind_blob(pUp, 2, p->hdr, 4+8*p->nVertex, SQLITE_TRANSIENT);
      }else{
        sqlite3_bind_value(pUp, 2, aData[2]);
      }
      sqlite3_free(p);
      nChange = 1;
    }
    for(jj=1; jj<nData-2; jj++){
      nChange++;
      sqlite3_bind_value(pUp, jj+2, aData[jj+2]);
    }
    if( nChange ){
      sqlite3_step(pUp);
      rc = sqlite3_reset(pUp);
    }
  }

geopoly_update_end:
  rtreeRelease(pRtree);
  return rc;
}